

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list_handler.c
# Opt level: O0

ion_cursor_status_t sldict_next(ion_dict_cursor_t *cursor,ion_record_t *record)

{
  ion_boolean_t iVar1;
  ion_sldict_cursor_t *sl_cursor;
  ion_record_t *record_local;
  ion_dict_cursor_t *cursor_local;
  
  if (cursor->status == '\x03') {
    cursor_local._7_1_ = cursor->status;
  }
  else if (cursor->status == '\x01') {
    cursor_local._7_1_ = cursor->status;
  }
  else if ((cursor->status == '\x02') || (cursor->status == '\x04')) {
    if (cursor->status == '\x04') {
      if ((*(long *)(cursor + 1) == 0) ||
         (iVar1 = test_predicate(cursor,(ion_key_t)**(undefined8 **)(cursor + 1)), iVar1 == '\0')) {
        cursor->status = '\x01';
        return cursor->status;
      }
    }
    else {
      cursor->status = '\x04';
    }
    memcpy(record->key,(void *)**(undefined8 **)(cursor + 1),
           (long)(cursor->dictionary->instance->record).key_size);
    memcpy(record->value,*(void **)(*(long *)(cursor + 1) + 8),
           (long)(cursor->dictionary->instance->record).value_size);
    *(undefined8 *)(cursor + 1) = **(undefined8 **)(*(long *)(cursor + 1) + 0x18);
    cursor_local._7_1_ = cursor->status;
  }
  else {
    cursor_local._7_1_ = '\0';
  }
  return cursor_local._7_1_;
}

Assistant:

ion_cursor_status_t
sldict_next(
	ion_dict_cursor_t	*cursor,
	ion_record_t		*record
) {
	ion_sldict_cursor_t *sl_cursor = (ion_sldict_cursor_t *) cursor;

	if (cursor->status == cs_cursor_uninitialized) {
		return cursor->status;
	}
	else if (cursor->status == cs_end_of_results) {
		return cursor->status;
	}
	else if ((cursor->status == cs_cursor_initialized) || (cursor->status == cs_cursor_active)) {
		if (cursor->status == cs_cursor_active) {
			if ((NULL == sl_cursor->current) || (test_predicate(cursor, sl_cursor->current->key) == boolean_false)) {
				cursor->status = cs_end_of_results;
				return cursor->status;
			}
		}
		else {
			/* The status is cs_cursor_initialized */
			cursor->status = cs_cursor_active;
		}

		/*Copy both key and value into user provided struct */
		memcpy(record->key, sl_cursor->current->key, cursor->dictionary->instance->record.key_size);
		memcpy(record->value, sl_cursor->current->value, cursor->dictionary->instance->record.value_size);

		sl_cursor->current = sl_cursor->current->next[0];
		return cursor->status;
	}

	return cs_invalid_cursor;
}